

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_persistence_matrix_column_boundary.cpp
# Opt level: O3

void __thiscall
Boundary_z2_column_other<Gudhi::persistence_matrix::Heap_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_>
::test_method(Boundary_z2_column_other<Gudhi::persistence_matrix::Heap_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_>
              *this)

{
  Column_settings settings;
  Column_settings local_69;
  vector<Gudhi::persistence_matrix::Heap_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Heap_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_>_>
  local_68;
  vector<Gudhi::persistence_matrix::Heap_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Heap_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_>_>
  local_48;
  vector<Gudhi::persistence_matrix::Heap_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Heap_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_>_>
  local_28;
  
  column_test_base_boundary_z2_methods<Gudhi::persistence_matrix::Heap_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>>
            ();
  build_base_boundary_column_matrix<Gudhi::persistence_matrix::Heap_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>>
            (&local_68,&local_69);
  column_test_boundary_methods<Gudhi::persistence_matrix::Heap_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>>
            (&local_68);
  build_column_matrix<Gudhi::persistence_matrix::Heap_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>>
            (&local_48,&local_69);
  local_28.
  super__Vector_base<Gudhi::persistence_matrix::Heap_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Heap_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_68.
       super__Vector_base<Gudhi::persistence_matrix::Heap_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Heap_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_28.
  super__Vector_base<Gudhi::persistence_matrix::Heap_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Heap_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_68.
       super__Vector_base<Gudhi::persistence_matrix::Heap_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Heap_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_28.
  super__Vector_base<Gudhi::persistence_matrix::Heap_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Heap_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_68.
       super__Vector_base<Gudhi::persistence_matrix::Heap_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Heap_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_68.
  super__Vector_base<Gudhi::persistence_matrix::Heap_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Heap_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_48.
       super__Vector_base<Gudhi::persistence_matrix::Heap_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Heap_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_68.
  super__Vector_base<Gudhi::persistence_matrix::Heap_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Heap_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_48.
       super__Vector_base<Gudhi::persistence_matrix::Heap_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Heap_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_68.
  super__Vector_base<Gudhi::persistence_matrix::Heap_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Heap_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_48.
       super__Vector_base<Gudhi::persistence_matrix::Heap_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Heap_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_48.
  super__Vector_base<Gudhi::persistence_matrix::Heap_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Heap_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<Gudhi::persistence_matrix::Heap_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Heap_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<Gudhi::persistence_matrix::Heap_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Heap_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<Gudhi::persistence_matrix::Heap_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Heap_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_>_>
  ::~vector(&local_28);
  std::
  vector<Gudhi::persistence_matrix::Heap_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Heap_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_>_>
  ::~vector(&local_48);
  column_test_boundary_chain_methods<Gudhi::persistence_matrix::Heap_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>>
            (&local_68);
  std::
  vector<Gudhi::persistence_matrix::Heap_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Heap_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_>_>
  ::~vector(&local_68);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE_TEMPLATE(Boundary_z2_column_other, Column, z2_no_row_access_columns) {
  typename Column::Column_settings settings;
  column_test_base_boundary_z2_methods<Column>();

  std::vector<Column> matrix = build_base_boundary_column_matrix<Column>(settings);
  column_test_boundary_methods<Column>(matrix);

  matrix = build_column_matrix<Column>(settings);
  column_test_boundary_chain_methods<Column>(matrix);
}